

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O0

void parser_info_cleanup(parser_info_conflict *info)

{
  int local_14;
  int i;
  parser_info_conflict *info_local;
  
  if (info->parser != (XML_Parser)0x0) {
    coda_XML_ParserFree(info->parser);
  }
  for (local_14 = 0; local_14 <= info->depth; local_14 = local_14 + 1) {
    if (info->record[local_14] != (coda_mem_record *)0x0) {
      coda_dynamic_type_delete((coda_dynamic_type *)info->record[local_14]);
    }
  }
  if (info->attributes != (coda_dynamic_type *)0x0) {
    coda_dynamic_type_delete(info->attributes);
  }
  if (info->value != (char *)0x0) {
    free(info->value);
  }
  return;
}

Assistant:

static void parser_info_cleanup(parser_info *info)
{
    int i;

    if (info->parser != NULL)
    {
        XML_ParserFree(info->parser);
    }
    for (i = 0; i <= info->depth; i++)
    {
        if (info->record[i] != NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)info->record[i]);
        }
    }
    if (info->attributes != NULL)
    {
        coda_dynamic_type_delete(info->attributes);
    }
    if (info->value != NULL)
    {
        free(info->value);
    }
}